

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O3

O3DGCErrorCode __thiscall
o3dgc::AdjacencyInfo::AddNeighbor(AdjacencyInfo *this,long element,long neighbor)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  
  if (this->m_numNeighbors[this->m_numElements + -1] < this->m_numNeighbors[element]) {
    __assert_fail("m_numNeighbors[element] <= m_numNeighbors[m_numElements-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcAdjacencyInfo.h"
                  ,0x6c,"O3DGCErrorCode o3dgc::AdjacencyInfo::AddNeighbor(long, long)");
  }
  lVar3 = Begin(this,element);
  lVar4 = End(this,element);
  bVar5 = true;
  if (lVar3 < lVar4) {
    plVar1 = this->m_neighbors;
    if (plVar1[lVar3] == -1) {
      bVar5 = false;
    }
    else {
      lVar6 = lVar3;
      do {
        if (lVar4 + -1 == lVar6) goto LAB_0037fbba;
        lVar3 = lVar6 + 1;
        lVar2 = lVar6 + 1;
        lVar6 = lVar3;
      } while (plVar1[lVar2] != -1);
      bVar5 = lVar4 <= lVar3;
    }
    plVar1[lVar3] = neighbor;
  }
LAB_0037fbba:
  return (O3DGCErrorCode)bVar5;
}

Assistant:

O3DGCErrorCode          AddNeighbor(long element, long neighbor)
                                {
                                    assert(m_numNeighbors[element] <= m_numNeighbors[m_numElements-1]);
                                    long p0 = Begin(element);
                                    long p1 = End(element);
                                    for(long p = p0; p < p1; p++)
                                    {
                                        if (m_neighbors[p] == -1)
                                        {
                                            m_neighbors[p] = neighbor;
                                            return O3DGC_OK;
                                        }
                                    }
                                    return O3DGC_ERROR_BUFFER_FULL;
                                }